

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

bool __thiscall Arbitrarydeque::Run(Arbitrarydeque *this)

{
  pointer *__return_storage_ptr__;
  size_type sVar1;
  reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  bool local_99;
  undefined1 local_80 [8];
  vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
  vv;
  deque<int,_std::allocator<int>_> v;
  Arbitrary<std::deque<int,_std::allocator<int>_>_> a;
  Arbitrarydeque *this_local;
  
  __return_storage_ptr__ =
       &vv.
        super__Vector_base<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  testinator::anon_unknown_6::Arbitrary_RandomSequence<std::deque<int,_std::allocator<int>_>_>::
  generate((deque<int,_std::allocator<int>_> *)__return_storage_ptr__,1,0);
  testinator::anon_unknown_6::Arbitrary_RandomSequence<std::deque<int,_std::allocator<int>_>_>::
  shrink((vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
          *)local_80,(deque<int,_std::allocator<int>_> *)__return_storage_ptr__);
  sVar1 = std::
          vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
          ::size((vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
                  *)local_80);
  local_99 = false;
  if (sVar1 == 2) {
    pvVar2 = std::
             vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
                           *)local_80,0);
    sVar1 = std::deque<int,_std::allocator<int>_>::size(pvVar2);
    pvVar2 = std::
             vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
                           *)local_80,1);
    sVar3 = std::deque<int,_std::allocator<int>_>::size(pvVar2);
    sVar4 = std::deque<int,_std::allocator<int>_>::size
                      ((deque<int,_std::allocator<int>_> *)
                       &vv.
                        super__Vector_base<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_99 = sVar1 + sVar3 == sVar4;
  }
  std::
  vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
             *)local_80);
  std::deque<int,_std::allocator<int>_>::~deque
            ((deque<int,_std::allocator<int>_> *)
             &vv.
              super__Vector_base<std::deque<int,_std::allocator<int>_>,_std::allocator<std::deque<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return local_99;
}

Assistant:

DEF_TEST(deque, Arbitrary)
{
  testinator::Arbitrary<deque<int>> a;
  deque<int> v = a.generate(1,0);
  vector<deque<int>> vv = a.shrink(v);
  return vv.size() == 2
    && vv[0].size() + vv[1].size() == v.size();
}